

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

ProfileId * __thiscall Js::FunctionBody::CreateCallSiteToCallApplyCallSiteArray(FunctionBody *this)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  void *pvVar5;
  undefined4 *puVar6;
  Recycler *this_00;
  char *ptr;
  ProfileId *pPVar7;
  ulong uVar8;
  uint i;
  ulong uVar9;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CallSiteToCallApplyCallSiteArray);
  if (pvVar5 != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x19da,"(this->GetCallSiteToCallApplyCallSiteArray() == nullptr)",
                                "this->GetCallSiteToCallApplyCallSiteArray() == nullptr");
    if (!bVar3) goto LAB_0076e96a;
    *puVar6 = 0;
  }
  uVar1 = this->profiledCallSiteCount;
  uVar8 = (ulong)uVar1;
  if (uVar8 != 0) {
    local_50 = (undefined1  [8])&unsigned_short::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x19de;
    data.plusSize = uVar8;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_0076e96a;
      *puVar6 = 0;
    }
    ptr = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                    (this_00,(ulong)((uint)uVar1 + (uint)uVar1));
    if (ptr == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_0076e96a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    FunctionProxy::SetAuxPtr((FunctionProxy *)this,CallSiteToCallApplyCallSiteArray,ptr);
    uVar9 = 0;
    do {
      pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,CallSiteToCallApplyCallSiteArray);
      *(undefined2 *)((long)pvVar5 + uVar9 * 2) = 0xffff;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  pPVar7 = (ProfileId *)
           FunctionProxy::GetAuxPtr((FunctionProxy *)this,CallSiteToCallApplyCallSiteArray);
  return pPVar7;
}

Assistant:

ProfileId* FunctionBody::CreateCallSiteToCallApplyCallSiteArray()
    {
        Assert(this->GetCallSiteToCallApplyCallSiteArray() == nullptr);
        uint count = this->GetProfiledCallSiteCount();
        if (count != 0)
        {
            this->SetCallSiteToCallApplyCallSiteArray(RecyclerNewArrayLeaf(this->m_scriptContext->GetRecycler(), ProfileId, count));
            for (uint i = 0; i < count; i++)
            {
                this->GetCallSiteToCallApplyCallSiteArray()[i] = Js::Constants::NoProfileId;
            }
        }
        return this->GetCallSiteToCallApplyCallSiteArray();
    }